

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O3

uint32 * __thiscall Js::IndexPropertyDescriptorMap::CopyIndexList(IndexPropertyDescriptorMap *this)

{
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  uint *puVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  Recycler *this_00;
  uint32 *puVar7;
  undefined4 *puVar8;
  long lVar9;
  size_t size;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pBVar1 = (this->indexPropertyMap).ptr;
  data.plusSize = (size_t)(pBVar1->count - pBVar1->freeCount);
  local_50 = (undefined1  [8])&unsigned_int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9b7fe41;
  data.filename._0_4_ = 0x1f;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
  pBVar1 = (this->indexPropertyMap).ptr;
  iVar5 = pBVar1->count - pBVar1->freeCount;
  if (iVar5 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    puVar7 = (uint32 *)&DAT_00000008;
  }
  else {
    size = 0xffffffffffffffff;
    if (-1 < iVar5) {
      size = (long)iVar5 * 4;
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_00db3681;
      *puVar8 = 0;
    }
    puVar7 = (uint32 *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,size);
    if (puVar7 == (uint32 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_00db3681:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
      puVar7 = (uint32 *)0x0;
    }
  }
  pBVar1 = (this->indexPropertyMap).ptr;
  if (0 < pBVar1->count - pBVar1->freeCount) {
    puVar2 = (this->indexList).ptr;
    lVar9 = 0;
    do {
      puVar7[lVar9] = puVar2[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < pBVar1->count - pBVar1->freeCount);
  }
  return puVar7;
}

Assistant:

uint32 * IndexPropertyDescriptorMap::CopyIndexList() const
    {
        uint32 * newList = RecyclerNewArrayLeaf(recycler, uint32, Count());
        for (int i = 0; i < Count(); i++)
        {
            newList[i] = this->indexList[i];
        }
        return newList;
    }